

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapter.h
# Opt level: O1

void __thiscall
bgui::ImageAdapter<float>::copyInto(ImageAdapter<float> *this,ImageU8 *rgb,long x,long y)

{
  int iVar1;
  uint uVar2;
  mapping mVar3;
  float ***pppfVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  uint ir;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  double dVar15;
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double b;
  double g;
  double r;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  uint local_74;
  double local_70;
  ulong local_68;
  double local_60;
  double local_58;
  long local_50;
  double local_48;
  undefined8 uStack_40;
  
  local_70 = 1.0;
  local_88 = 1.0 / (this->super_ImageAdapterBase).scale;
  local_90 = (this->super_ImageAdapterBase).imax - (this->super_ImageAdapterBase).imin;
  lVar9 = this->image->width;
  lVar7 = this->image->height;
  local_50 = y;
  if (0.0 < local_90) {
    dVar15 = log(local_90);
    dVar15 = floor(dVar15 / 2.302585092994046);
    local_70 = pow(10.0,dVar15 + -1.0);
  }
  if (((this->super_ImageAdapterBase).rotation & 1) != 0) {
    lVar7 = this->image->width;
    lVar9 = this->image->height;
  }
  iVar1 = this->image->depth;
  local_68 = (ulong)(2 < iVar1);
  uVar2 = (this->super_ImageAdapterBase).channel;
  local_74 = (uint)(2 < iVar1) * 2;
  if (-1 < (int)uVar2 && (int)uVar2 < iVar1) {
    local_68 = (ulong)uVar2;
    local_74 = uVar2;
  }
  ir = 0;
  if (-1 < (int)uVar2 && (int)uVar2 < iVar1) {
    ir = uVar2;
  }
  if (0 < rgb->height) {
    local_58 = (double)lVar7;
    local_60 = (double)x;
    local_a8 = (double)lVar9;
    lVar9 = 0;
    dVar15 = local_88;
    do {
      local_a0 = (this->super_ImageAdapterBase).scale;
      local_80 = (double)(local_50 + lVar9) / local_a0;
      uVar11 = 0;
      if ((0.0 <= local_80) && (uVar11 = 0, local_80 < local_58)) {
        local_a0 = local_60 / local_a0;
        uVar11 = 0;
        if (local_a0 < 0.0) {
          uVar11 = 0;
          do {
            if (rgb->width <= (long)uVar11) break;
            (*rgb->img)[lVar9][uVar11] = '\0';
            rgb->img[1][lVar9][uVar11] = '\0';
            rgb->img[2][lVar9][uVar11] = '\0';
            local_a0 = local_a0 + dVar15;
            uVar11 = uVar11 + 1;
          } while (local_a0 < 0.0);
        }
        if (((uint)local_68 == ir) && (mVar3 = (this->super_ImageAdapterBase).map, mVar3 != map_raw)
           ) {
          if (mVar3 == map_jet) {
            if (local_a0 < local_a8) {
              uVar11 = uVar11 & 0xffffffff;
              do {
                if (rgb->width <= (long)uVar11) break;
                dVar17 = (double)(this->super_ImageAdapterBase).R.v[0][2] +
                         (double)(this->super_ImageAdapterBase).R.v[0][0] * local_a0 +
                         (double)(this->super_ImageAdapterBase).R.v[0][1] * local_80;
                dVar18 = (double)(this->super_ImageAdapterBase).R.v[1][2] +
                         (double)(this->super_ImageAdapterBase).R.v[1][0] * local_a0 +
                         (double)(this->super_ImageAdapterBase).R.v[1][1] * local_80;
                dVar15 = getPixel(this,(float)dVar17,(float)dVar18,ir);
                uVar6 = (ulong)this->image->depth;
                bVar12 = (long)uVar6 < 1;
                if ((long)uVar6 < 1) {
LAB_00122e3e:
                  if (!bVar12) goto LAB_00122eab;
                  dVar17 = (this->super_ImageAdapterBase).imin;
                  dVar18 = -0.05;
                  if ((dVar17 <= dVar15) &&
                     (dVar18 = 1.05, dVar15 <= (this->super_ImageAdapterBase).imax)) {
                    dVar18 = (dVar15 - dVar17) / local_90;
                    dVar15 = (this->super_ImageAdapterBase).gamma;
                    if ((dVar15 != 1.0) || (NAN(dVar15))) {
                      if ((int)(dVar15 + 0.5) == 2) {
                        if (dVar18 < 0.0) {
                          dVar18 = sqrt(dVar18);
                        }
                        else {
                          dVar18 = SQRT(dVar18);
                        }
                      }
                      else if (2 < (int)(dVar15 + 0.5)) {
                        dVar18 = 0.0;
                      }
                    }
                  }
                  dVar15 = dVar18 / 1.15 + 0.1;
                  auVar16._0_8_ = ABS(dVar15 + -0.75) * -4.0 + 1.5;
                  auVar16._8_8_ = ABS(dVar15 + -0.5) * -4.0 + 1.5;
                  auVar16 = minpd(auVar16,_DAT_001526d0);
                  auVar16 = maxpd(auVar16,_DAT_001526f0);
                  dVar15 = ABS(dVar15 + -0.25) * -4.0 + 1.5;
                  if (1.0 <= dVar15) {
                    dVar15 = 1.0;
                  }
                  if (dVar15 <= 0.0) {
                    dVar15 = 0.0;
                  }
                }
                else {
                  lVar7 = (long)dVar17;
                  lVar8 = (long)dVar18;
                  pppfVar4 = this->image->img;
                  if ((uint)ABS((*pppfVar4)[lVar8][lVar7]) < 0x7f800000) {
                    uVar5 = 1;
                    do {
                      uVar10 = uVar5;
                      if (uVar6 == uVar10) break;
                      uVar5 = uVar10 + 1;
                    } while ((uint)ABS(pppfVar4[uVar10][lVar8][lVar7]) < 0x7f800000);
                    bVar12 = uVar6 <= uVar10;
                    goto LAB_00122e3e;
                  }
LAB_00122eab:
                  auVar16 = ZEXT816(0);
                  dVar15 = 0.0;
                }
                (*rgb->img)[lVar9][uVar11] = (uchar)(int)(auVar16._0_8_ * 255.0 + 0.5);
                rgb->img[1][lVar9][uVar11] = (uchar)(int)(auVar16._8_8_ * 255.0 + 0.5);
                rgb->img[2][lVar9][uVar11] = (uchar)(int)(dVar15 * 255.0 + 0.5);
                local_a0 = local_a0 + local_88;
                uVar11 = uVar11 + 1;
                dVar15 = local_88;
              } while (local_a0 < local_a8);
            }
          }
          else if ((mVar3 == map_rainbow) && (local_a0 < local_a8)) {
            uVar11 = uVar11 & 0xffffffff;
            do {
              if (rgb->width <= (long)uVar11) break;
              dVar17 = (double)(this->super_ImageAdapterBase).R.v[0][2] +
                       (double)(this->super_ImageAdapterBase).R.v[0][0] * local_a0 +
                       (double)(this->super_ImageAdapterBase).R.v[0][1] * local_80;
              dVar18 = (double)(this->super_ImageAdapterBase).R.v[1][2] +
                       (double)(this->super_ImageAdapterBase).R.v[1][0] * local_a0 +
                       (double)(this->super_ImageAdapterBase).R.v[1][1] * local_80;
              dVar15 = getPixel(this,(float)dVar17,(float)dVar18,ir);
              uVar6 = (ulong)this->image->depth;
              bVar12 = (long)uVar6 < 1;
              if ((long)uVar6 < 1) {
LAB_00122807:
                dVar17 = 0.0;
                dVar18 = 0.0;
                dVar20 = 0.0;
                if (bVar12) {
                  dVar20 = (this->super_ImageAdapterBase).imin;
                  dVar19 = (this->super_ImageAdapterBase).imax;
                  dVar17 = dVar20;
                  if (dVar20 <= dVar15) {
                    dVar17 = dVar15;
                  }
                  if (dVar17 <= dVar19) {
                    dVar19 = dVar17;
                  }
                  local_48 = dVar19 / local_70;
                  uStack_40 = 0;
                  dVar15 = floor(local_48);
                  dVar17 = (local_48 - dVar15) * 6.0;
                  dVar18 = dVar17 - (double)(int)dVar17;
                  dVar15 = 0.0;
                  switch((int)dVar17) {
                  case 0:
                    dVar17 = 1.0;
                    break;
                  case 1:
                    dVar17 = 1.0 - dVar18;
                    dVar15 = 0.0;
                    dVar18 = 1.0;
                    break;
                  case 2:
                    dVar17 = 0.0;
                    dVar15 = dVar18;
                    dVar18 = 1.0;
                    break;
                  case 3:
                    dVar17 = 0.0;
                    dVar15 = 1.0;
                    dVar18 = 1.0 - dVar18;
                    break;
                  case 4:
                    dVar17 = dVar18;
                    dVar15 = 1.0;
                    dVar18 = 0.0;
                    break;
                  default:
                    dVar17 = 1.0;
                    dVar15 = 1.0 - dVar18;
                    dVar18 = 0.0;
                  }
                  dVar20 = ((dVar19 - dVar20) * 1.6) / local_90 + -0.8;
                  if (0.0 <= dVar20) {
                    dVar19 = 1.0 - dVar20;
                    dVar17 = dVar17 * dVar19 + dVar20;
                    dVar18 = dVar18 * dVar19 + dVar20;
                    dVar20 = dVar20 + dVar19 * dVar15;
                  }
                  else {
                    dVar20 = dVar20 + 1.0;
                    dVar17 = dVar17 * dVar20;
                    dVar18 = dVar18 * dVar20;
                    dVar20 = dVar20 * dVar15;
                  }
                }
              }
              else {
                lVar7 = (long)dVar17;
                lVar8 = (long)dVar18;
                pppfVar4 = this->image->img;
                dVar17 = 0.0;
                dVar18 = 0.0;
                dVar20 = 0.0;
                if ((uint)ABS((*pppfVar4)[lVar8][lVar7]) < 0x7f800000) {
                  uVar5 = 1;
                  do {
                    uVar10 = uVar5;
                    if (uVar6 == uVar10) break;
                    uVar5 = uVar10 + 1;
                  } while ((uint)ABS(pppfVar4[uVar10][lVar8][lVar7]) < 0x7f800000);
                  bVar12 = uVar6 <= uVar10;
                  goto LAB_00122807;
                }
              }
              (*rgb->img)[lVar9][uVar11] = (uchar)(int)(dVar17 * 255.0 + 0.5);
              rgb->img[1][lVar9][uVar11] = (uchar)(int)(dVar18 * 255.0 + 0.5);
              rgb->img[2][lVar9][uVar11] = (uchar)(int)(dVar20 * 255.0 + 0.5);
              local_a0 = local_a0 + local_88;
              uVar11 = uVar11 + 1;
              dVar15 = local_88;
            } while (local_a0 < local_a8);
          }
        }
        else if (local_a0 < local_a8) {
          uVar11 = uVar11 & 0xffffffff;
          do {
            if (rgb->width <= (long)uVar11) break;
            getPixel(this,&local_98,&local_b0,&local_b8,
                     (float)((double)(this->super_ImageAdapterBase).R.v[0][2] +
                            (double)(this->super_ImageAdapterBase).R.v[0][0] * local_a0 +
                            (double)(this->super_ImageAdapterBase).R.v[0][1] * local_80),
                     (float)((double)(this->super_ImageAdapterBase).R.v[1][2] +
                            (double)(this->super_ImageAdapterBase).R.v[1][0] * local_a0 +
                            (double)(this->super_ImageAdapterBase).R.v[1][1] * local_80),ir,
                     (int)local_68,local_74);
            uVar13 = SUB84(local_98,0);
            uVar14 = (undefined4)((ulong)local_98 >> 0x20);
            dVar15 = (this->super_ImageAdapterBase).imin;
            dVar17 = (this->super_ImageAdapterBase).imax;
            if (dVar17 <= local_98) {
              uVar13 = SUB84(dVar17,0);
              uVar14 = (undefined4)((ulong)dVar17 >> 0x20);
            }
            if ((double)CONCAT44(uVar14,uVar13) <= dVar15) {
              uVar13 = SUB84(dVar15,0);
              uVar14 = (undefined4)((ulong)dVar15 >> 0x20);
            }
            local_98 = ((double)CONCAT44(uVar14,uVar13) - dVar15) / local_90;
            dVar18 = (double)(~-(ulong)(local_b0 < dVar17) &
                              (ulong)(this->super_ImageAdapterBase).imax |
                             (ulong)local_b0 & -(ulong)(local_b0 < dVar17));
            uVar6 = -(ulong)(dVar15 < dVar18);
            local_b0 = ((double)(~uVar6 & (ulong)(this->super_ImageAdapterBase).imin |
                                uVar6 & (ulong)dVar18) - dVar15) / local_90;
            dVar17 = (double)(~-(ulong)(local_b8 < dVar17) &
                              (ulong)(this->super_ImageAdapterBase).imax |
                             (ulong)local_b8 & -(ulong)(local_b8 < dVar17));
            uVar6 = -(ulong)(dVar15 < dVar17);
            local_b8 = ((double)(~uVar6 & (ulong)(this->super_ImageAdapterBase).imin |
                                uVar6 & (ulong)dVar17) - dVar15) / local_90;
            dVar15 = (this->super_ImageAdapterBase).gamma;
            if ((dVar15 != 1.0) || (NAN(dVar15))) {
              if ((int)(dVar15 + 0.5) == 2) {
                if (local_98 < 0.0) {
                  local_98 = sqrt(local_98);
                }
                else {
                  local_98 = SQRT(local_98);
                }
                if (local_b0 < 0.0) {
                  local_b0 = sqrt(local_b0);
                  dVar15 = local_b8;
                }
                else {
                  local_b0 = SQRT(local_b0);
                  dVar15 = local_b8;
                }
              }
              else {
                if ((int)(dVar15 + 0.5) < 3) goto LAB_00122c0c;
                if (local_98 < 0.0) {
                  dVar15 = sqrt(local_98);
                }
                else {
                  dVar15 = SQRT(local_98);
                }
                if (dVar15 < 0.0) {
                  local_98 = sqrt(dVar15);
                }
                else {
                  local_98 = SQRT(dVar15);
                }
                if (local_b0 < 0.0) {
                  dVar15 = sqrt(local_b0);
                }
                else {
                  dVar15 = SQRT(local_b0);
                }
                if (dVar15 < 0.0) {
                  local_b0 = sqrt(dVar15);
                }
                else {
                  local_b0 = SQRT(dVar15);
                }
                if (local_b8 < 0.0) {
                  dVar15 = sqrt(local_b8);
                }
                else {
                  dVar15 = SQRT(local_b8);
                }
              }
              if (dVar15 < 0.0) {
                local_b8 = sqrt(dVar15);
              }
              else {
                local_b8 = SQRT(dVar15);
              }
            }
LAB_00122c0c:
            (*rgb->img)[lVar9][uVar11] = (uchar)(int)(local_98 * 255.0 + 0.5);
            rgb->img[1][lVar9][uVar11] = (uchar)(int)(local_b0 * 255.0 + 0.5);
            rgb->img[2][lVar9][uVar11] = (uchar)(int)(local_b8 * 255.0 + 0.5);
            local_a0 = local_a0 + local_88;
            uVar11 = uVar11 + 1;
            dVar15 = local_88;
          } while (local_a0 < local_a8);
        }
      }
      for (lVar7 = (long)(int)uVar11; lVar7 < rgb->width; lVar7 = lVar7 + 1) {
        (*rgb->img)[lVar9][lVar7] = '\0';
        rgb->img[1][lVar9][lVar7] = '\0';
        rgb->img[2][lVar9][lVar7] = '\0';
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < rgb->height);
  }
  return;
}

Assistant:

void copyInto(gimage::ImageU8 &rgb, long x, long y) const
    {
      const double step=1/scale;
      const double irange=imax-imin;
      int ir=0, ig=1, ib=2;
      long iw=image->getWidth();
      long ih=image->getHeight();
      double rainbow_size=1;

      if (irange > 0)
      {
        rainbow_size=std::pow(10, std::floor(std::log(irange)/std::log(10))-1);
      }

      if ((rotation&1) != 0)
      {
        iw=image->getHeight();
        ih=image->getWidth();
      }

      assert(rgb.getDepth() == 3);

      if (image->getDepth() < 3)
      {
        ir=ig=ib=0;
      }

      if (channel >= 0 && channel < image->getDepth())
      {
        ir=ig=ib=channel;
      }

      for (int k=0; k<rgb.getHeight(); k++)
      {
        double yf=(y+k)/scale;

        int i=0;

        if (yf >= 0 && yf < ih)
        {
          double xf=x/scale;

          while (xf < 0 && i < rgb.getWidth())
          {
            rgb.set(i, k, 0, 0);
            rgb.set(i, k, 1, 0);
            rgb.set(i, k, 2, 0);

            xf+=step;
            i++;
          }

          if (ig != ir || map == map_raw)
          {
            // map color image or greyscale image directly

            while (xf < iw && i < rgb.getWidth())
            {
              float xs=static_cast<float>(R(0, 0)*xf+R(0, 1)*yf+R(0, 2));
              float ys=static_cast<float>(R(1, 0)*xf+R(1, 1)*yf+R(1, 2));

              double r, g, b;
              getPixel(r, g, b, xs, ys, ir, ig, ib);

              r=(std::max(imin, std::min(imax, r))-imin)/irange;
              g=(std::max(imin, std::min(imax, g))-imin)/irange;
              b=(std::max(imin, std::min(imax, b))-imin)/irange;

              if (gamma != 1.0)
              {
                // pow() can be extremly slow and linear lookup tables would be
                // very big for data with higher radiometric depth, thats why we
                // only allow a gamma with root of 2 and 4.

                if (static_cast<int>(gamma+0.5) == 2)
                {
                  r=sqrt(r);
                  g=sqrt(g);
                  b=sqrt(b);
                }
                else if (static_cast<int>(gamma+0.5) >= 3)
                {
                  r=sqrt(sqrt(r));
                  g=sqrt(sqrt(g));
                  b=sqrt(sqrt(b));
                }
              }

              rgb.set(i, k, 0, static_cast<char>(255*r+0.5));
              rgb.set(i, k, 1, static_cast<char>(255*g+0.5));
              rgb.set(i, k, 2, static_cast<char>(255*b+0.5));

              xf+=step;
              i++;
            }
          }
          else if (map == map_jet)
          {
            // map greyscale image using jet encoding

            while (xf < iw && i < rgb.getWidth())
            {
              float xs=static_cast<float>(R(0, 0)*xf+R(0, 1)*yf+R(0, 2));
              float ys=static_cast<float>(R(1, 0)*xf+R(1, 1)*yf+R(1, 2));

              double v=getPixel(xs, ys, ir);
              double r=0.0;
              double g=0.0;
              double b=0.0;

              if (image->isValid(static_cast<long>(xs), static_cast<long>(ys)))
              {
                if (v >= imin)
                {
                  if (v <= imax)
                  {
                    v=(v-imin)/irange;

                    if (gamma != 1.0)
                    {
                      // pow() can be extremly slow and linear lookup tables would be
                      // very big for data with higher radiometric depth, thats why we
                      // only allow a gamma with root of 2 and 4.

                      if (static_cast<int>(gamma+0.5) == 2)
                      {
                        v=sqrt(v);
                      }
                      else if (static_cast<int>(gamma+0.5) >= 3)
                      {
                        v=sqrt(sqrt(r));
                      }
                    }
                  }
                  else
                  {
                    v=1.05;
                  }
                }
                else
                {
                  v=-0.05;
                }

                v=v/1.15+0.1;
                r=std::max(0.0, std::min(1.0, (1.5 - 4*fabs(v-0.75))));
                g=std::max(0.0, std::min(1.0, (1.5 - 4*fabs(v-0.5))));
                b=std::max(0.0, std::min(1.0, (1.5 - 4*fabs(v-0.25))));
              }

              rgb.set(i, k, 0, static_cast<char>(255*r+0.5));
              rgb.set(i, k, 1, static_cast<char>(255*g+0.5));
              rgb.set(i, k, 2, static_cast<char>(255*b+0.5));

              xf+=step;
              i++;
            }
          }
          else if (map == map_rainbow)
          {
            while (xf < iw && i < rgb.getWidth())
            {
              float xs=static_cast<float>(R(0, 0)*xf+R(0, 1)*yf+R(0, 2));
              float ys=static_cast<float>(R(1, 0)*xf+R(1, 1)*yf+R(1, 2));

              double v=getPixel(xs, ys, ir);
              double r=0.0;
              double g=0.0;
              double b=0.0;

              if (image->isValid(static_cast<long>(xs), static_cast<long>(ys)))
              {
                if (v < imin)
                {
                  v=imin;
                }

                if (v > imax)
                {
                  v=imax;
                }

                // compute color

                double v1=v/rainbow_size;

                v1=6.0*(v1-floor(v1));

                int v0=static_cast<int>(v1);

                v1-=v0;

                switch (v0)
                {
                  case 0:
                    r=1.0;
                    g=v1;
                    break;

                  case 1:
                    r=1.0-v1;
                    g=1.0;
                    break;

                  case 2:
                    g=1.0;
                    b=v1;
                    break;

                  case 3:
                    g=1.0-v1;
                    b=1.0;
                    break;

                  case 4:
                    b=1.0;
                    r=v1;
                    break;

                  default:
                    b=1.0-v1;
                    r=1.0;
                    break;
                }

                // compute brightness

                v=1.6*(v-imin)/irange-0.8;

                if (v < 0)
                {
                  r*=v+1;
                  g*=v+1;
                  b*=v+1;
                }
                else
                {
                  r=(1-v)*r+v;
                  g=(1-v)*g+v;
                  b=(1-v)*b+v;
                }
              }

              rgb.set(i, k, 0, static_cast<int>(255*r+0.5));
              rgb.set(i, k, 1, static_cast<int>(255*g+0.5));
              rgb.set(i, k, 2, static_cast<int>(255*b+0.5));

              xf+=step;
              i++;
            }
          }
        }

        while (i < rgb.getWidth())
        {
          rgb.set(i, k, 0, 0);
          rgb.set(i, k, 1, 0);
          rgb.set(i, k, 2, 0);

          i++;
        }
      }
    }